

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::AttachmentObjectCase::test(AttachmentObjectCase *this)

{
  GLuint local_1c;
  GLuint local_18;
  GLuint renderbufferID;
  GLuint textureID;
  GLuint framebufferID;
  AttachmentObjectCase *this_local;
  
  renderbufferID = 0;
  _textureID = this;
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&renderbufferID);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_18 = 0;
  glu::CallLogWrapper::glGenTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindTexture(&(this->super_ApiCase).super_CallLogWrapper,0xde1,local_18);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ApiCase).super_CallLogWrapper,0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,
             (void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,local_18,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd0,0x1702);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd1,local_18);
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_18);
  local_1c = 0;
  glu::CallLogWrapper::glGenRenderbuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_1c);
  glu::CallLogWrapper::glBindRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,local_1c);
  glu::CallLogWrapper::glRenderbufferStorage
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d41,0x8056,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0x8d41,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd0,0x8d41);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd1,local_1c);
  glu::CallLogWrapper::glFramebufferRenderbuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0x8d41,0);
  glu::CallLogWrapper::glDeleteRenderbuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&local_1c);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&(this->super_ApiCase).super_CallLogWrapper,1,&renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// texture
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, 0);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, textureID);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		// rb
		{
			GLuint renderbufferID = 0;
			glGenRenderbuffers(1, &renderbufferID);
			glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
			glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbufferID);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_RENDERBUFFER);
			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, renderbufferID);

			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0);
			glDeleteRenderbuffers(1, &renderbufferID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}